

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O1

state_status_t
tchecker::zg::prev(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
                  vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *src_invariant
                  ,clock_constraint_container_t *guard,clock_reset_container_t *reset,
                  clock_constraint_container_t *tgt_invariant,semantics_t *semantics,
                  extrapolation_t *extrapolation,incoming_edges_value_t *v)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  state_status_t sVar4;
  db_t *pdVar5;
  
  if (&vloc->_t->super_vloc_t == (vloc_t *)0x0) goto LAB_00135b22;
  bVar2 = ta::delay_allowed(system,&vloc->_t->super_vloc_t);
  sVar4 = ta::prev(system,vloc,intval,vedge,sync_id,src_invariant,guard,reset,tgt_invariant,v);
  if (sVar4 != 1) {
    return sVar4;
  }
  if (&zone->_t->super_zone_t != (zone_t *)0x0) {
    pdVar5 = zone_t::dbm(&zone->_t->super_zone_t);
    if (zone->_t != (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0) {
      if (&vloc->_t->super_vloc_t == (vloc_t *)0x0) {
LAB_00135b22:
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1d0,
                      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
                     );
      }
      uVar1 = (zone->_t->super_zone_t)._dim;
      bVar3 = ta::delay_allowed(system,&vloc->_t->super_vloc_t);
      sVar4 = (*semantics->_vptr_semantics_t[5])
                        (semantics,pdVar5,(ulong)uVar1,(ulong)bVar3,src_invariant,guard,reset,
                         (ulong)bVar2,tgt_invariant);
      if (sVar4 == 1) {
        if (vloc->_t == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0)
        goto LAB_00135b22;
        (*extrapolation->_vptr_extrapolation_t[2])(extrapolation,pdVar5,(ulong)uVar1);
        sVar4 = 1;
      }
      return sVar4;
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
               );
}

Assistant:

tchecker::state_status_t prev(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                              tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                              tchecker::clock_constraint_container_t & src_invariant,
                              tchecker::clock_constraint_container_t & guard, tchecker::clock_reset_container_t & reset,
                              tchecker::clock_constraint_container_t & tgt_invariant, tchecker::zg::semantics_t & semantics,
                              tchecker::zg::extrapolation_t & extrapolation, tchecker::zg::incoming_edges_value_t const & v)
{
  bool tgt_delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  tchecker::state_status_t status =
      tchecker::ta::prev(system, vloc, intval, vedge, sync_id, src_invariant, guard, reset, tgt_invariant, v);
  if (status != tchecker::STATE_OK)
    return status;

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t dim = zone->dim();
  bool src_delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  status = semantics.prev(dbm, dim, src_delay_allowed, src_invariant, guard, reset, tgt_delay_allowed, tgt_invariant);
  if (status != tchecker::STATE_OK)
    return status;

  extrapolation.extrapolate(dbm, dim, *vloc);

  return tchecker::STATE_OK;
}